

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

FExecList * C_ParseExecFile(char *file,FExecList *exec)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  char *pcStack_1040;
  int inQuote;
  char *comment;
  char *stop;
  char local_1028 [4];
  int retval;
  char cmd [4096];
  FILE *f;
  FExecList *exec_local;
  char *file_local;
  
  __stream = fopen(file,"r");
  f = (FILE *)exec;
  if (__stream == (FILE *)0x0) {
    Printf("Could not open \"%s\"\n",file);
  }
  else {
    while (pcVar3 = fgets(local_1028,0xfff,__stream), pcVar3 != (char *)0x0) {
      sVar4 = strlen(local_1028);
      pcVar3 = local_1028 + (sVar4 - 1);
      pcStack_1040 = local_1028;
      bVar1 = false;
      comment = pcVar3;
      if (*pcVar3 == '\n') {
        comment = local_1028 + (sVar4 - 2);
        *pcVar3 = '\0';
      }
      for (; pcStack_1040 < comment; pcStack_1040 = pcStack_1040 + 1) {
        if (*pcStack_1040 == '\"') {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        else if (((!bVar1) && (*pcStack_1040 == '/')) && (pcStack_1040[1] == '/')) break;
      }
      if (pcStack_1040 != local_1028) {
        if (pcStack_1040 < comment) {
          *pcStack_1040 = '\0';
        }
        if (f == (FILE *)0x0) {
          f = (FILE *)operator_new(0x20);
          FExecList::FExecList((FExecList *)f);
        }
        FExecList::AddCommand((FExecList *)f,local_1028,file);
      }
    }
    iVar2 = feof(__stream);
    if (iVar2 == 0) {
      Printf("Error parsing \"%s\"\n",file);
    }
    fclose(__stream);
  }
  return (FExecList *)f;
}

Assistant:

FExecList *C_ParseExecFile(const char *file, FExecList *exec)
{
	FILE *f;
	char cmd[4096];
	int retval = 0;

	if ( (f = fopen (file, "r")) )
	{
		while (fgets(cmd, countof(cmd)-1, f))
		{
			// Comments begin with //
			char *stop = cmd + strlen(cmd) - 1;
			char *comment = cmd;
			int inQuote = 0;

			if (*stop == '\n')
				*stop-- = 0;

			while (comment < stop)
			{
				if (*comment == '\"')
				{
					inQuote ^= 1;
				}
				else if (!inQuote && *comment == '/' && *(comment + 1) == '/')
				{
					break;
				}
				comment++;
			}
			if (comment == cmd)
			{ // Comment at line beginning
				continue;
			}
			else if (comment < stop)
			{ // Comment in middle of line
				*comment = 0;
			}
			if (exec == NULL)
			{
				exec = new FExecList;
			}
			exec->AddCommand(cmd, file);
		}
		if (!feof(f))
		{
			Printf("Error parsing \"%s\"\n", file);
		}
		fclose(f);
	}
	else
	{
		Printf ("Could not open \"%s\"\n", file);
	}
	return exec;
}